

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O1

int __thiscall xmrig::HttpContext::close(HttpContext *this,int __fd)

{
  IHttpListener *pIVar1;
  ulong uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  iterator __position;
  
  if ((__fd < 0) && (pIVar1 = this->m_listener, pIVar1 != (IHttpListener *)0x0)) {
    (this->super_HttpData).status = __fd;
    (*pIVar1->_vptr_IHttpListener[2])(pIVar1,&this->super_HttpData);
  }
  uVar2 = (this->super_HttpData).m_id;
  p_Var4 = (_Base_ptr)(storage + 8);
  if (storage._16_8_ != 0) {
    p_Var4 = (_Base_ptr)(storage + 8);
    p_Var5 = (_Base_ptr)storage._16_8_;
    do {
      if (*(ulong *)(p_Var5 + 1) >= uVar2) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  __position._M_node = (_Base_ptr)(storage + 8);
  if ((p_Var4 != (_Base_ptr)(storage + 8)) &&
     (__position._M_node = (_Base_ptr)(storage + 8), *(ulong *)(p_Var4 + 1) <= uVar2)) {
    __position._M_node = p_Var4;
  }
  if (__position._M_node != (_Base_ptr)(storage + 8)) {
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,xmrig::HttpContext*>,std::_Select1st<std::pair<unsigned_long_const,xmrig::HttpContext*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::HttpContext*>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,xmrig::HttpContext*>,std::_Select1st<std::pair<unsigned_long_const,xmrig::HttpContext*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::HttpContext*>>>
                        *)storage,__position);
  }
  iVar3 = uv_is_closing(this->m_tcp);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = uv_close(this->m_tcp,close::anon_class_1_0_00000001::__invoke);
  return iVar3;
}

Assistant:

void xmrig::HttpContext::close(int status)
{
    if (status < 0 && m_listener) {
        this->status = status;
        m_listener->onHttpData(*this);
    }

    auto it = storage.find(id());
    if (it != storage.end()) {
        storage.erase(it);
    }

    if (!uv_is_closing(handle())) {
        uv_close(handle(), [](uv_handle_t *handle) -> void { delete reinterpret_cast<HttpContext*>(handle->data); });
    }
}